

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffcnvthdr2str(fitsfile *fptr,int exclude_comm,char **exclist,int nexc,char **header,int *nkeys,
                 int *status)

{
  int iVar1;
  fitsfile *local_48;
  fitsfile *tempfptr;
  int *nkeys_local;
  char **header_local;
  char **ppcStack_28;
  int nexc_local;
  char **exclist_local;
  fitsfile *pfStack_18;
  int exclude_comm_local;
  fitsfile *fptr_local;
  
  if (0 < *status) {
    return *status;
  }
  tempfptr = (fitsfile *)nkeys;
  nkeys_local = (int *)header;
  header_local._4_4_ = nexc;
  ppcStack_28 = exclist;
  exclist_local._4_4_ = exclude_comm;
  pfStack_18 = fptr;
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    ffhdr2str(pfStack_18,exclist_local._4_4_,ppcStack_28,header_local._4_4_,(char **)nkeys_local,
              &tempfptr->HDUposition,status);
  }
  else {
    iVar1 = ffinit(&local_48,"mem://",status);
    if (0 < iVar1) {
      return *status;
    }
    iVar1 = fits_img_decompress_header(pfStack_18,local_48,status);
    if (0 < iVar1) {
      ffdelt(local_48,status);
      return *status;
    }
    ffhdr2str(local_48,exclist_local._4_4_,ppcStack_28,header_local._4_4_,(char **)nkeys_local,
              &tempfptr->HDUposition,status);
    ffclos(local_48,status);
  }
  return *status;
}

Assistant:

int ffcnvthdr2str( fitsfile *fptr,  /* I - FITS file pointer                    */
            int exclude_comm,   /* I - if TRUE, exclude commentary keywords */
            char **exclist,     /* I - list of excluded keyword names       */
            int nexc,           /* I - number of names in exclist           */
            char **header,      /* O - returned header string               */
            int *nkeys,         /* O - returned number of 80-char keywords  */
            int  *status)       /* IO - error status                        */
/*
  Same as ffhdr2str, except that if the input HDU is a tile compressed image
  (stored in a binary table) then it will first convert that header back
  to that of a normal uncompressed FITS image before concatenating the header
  keyword records.
*/
{
    fitsfile *tempfptr;
    
    if (*status > 0)
        return(*status);

    if (fits_is_compressed_image(fptr, status) )
    {
        /* this is a tile compressed image, so need to make an uncompressed */
	/* copy of the image header in memory before concatenating the keywords */
        if (fits_create_file(&tempfptr, "mem://", status) > 0) {
	    return(*status);
	}

	if (fits_img_decompress_header(fptr, tempfptr, status) > 0) {
	    fits_delete_file(tempfptr, status);
	    return(*status);
	}

	ffhdr2str(tempfptr, exclude_comm, exclist, nexc, header, nkeys, status);
	fits_close_file(tempfptr, status);

    } else {
        ffhdr2str(fptr, exclude_comm, exclist, nexc, header, nkeys, status);
    }

    return(*status);
}